

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFlatImage.cpp
# Opt level: O0

void anon_unknown.dwarf_13ad8::testTiledImage
               (Box2i *dataWindow,string *fileName,LevelMode levelMode,
               LevelRoundingMode levelRoundingMode)

{
  ostream *poVar1;
  void *this;
  int in_ECX;
  int in_EDX;
  int *in_RDI;
  DeepImage img2;
  Rand48 random;
  DeepImage img1;
  unsigned_long in_stack_fffffffffffffe18;
  Rand48 *in_stack_fffffffffffffe20;
  DeepImage *img;
  DeepImage *in_stack_fffffffffffffe50;
  allocator<char> *__a;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  int in_stack_fffffffffffffe80;
  PixelType in_stack_fffffffffffffe84;
  string *in_stack_fffffffffffffe88;
  Image *in_stack_fffffffffffffe90;
  LevelRoundingMode in_stack_fffffffffffffeb0;
  LevelMode in_stack_fffffffffffffeb4;
  Box2i *in_stack_fffffffffffffeb8;
  Image *in_stack_fffffffffffffec0;
  allocator<char> local_129;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [39];
  undefined1 local_d9 [40];
  allocator<char> local_b1;
  string local_b0 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [3];
  int local_18;
  int local_14;
  int *local_8;
  
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_8 = in_RDI;
  poVar1 = std::operator<<((ostream *)&std::cout,"tiles, data window = (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*local_8);
  pcVar2 = ", ";
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_8[1]);
  poVar1 = std::operator<<(poVar1,") - (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_8[2]);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_8[3]);
  poVar1 = std::operator<<(poVar1,"), level mode = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_14);
  poVar1 = std::operator<<(poVar1,", rounding mode = ");
  this = (void *)std::ostream::operator<<(poVar1,local_18);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  this_00 = local_80;
  Imf_2_5::DeepImage::DeepImage(in_stack_fffffffffffffe50);
  Imf_2_5::Image::resize
            (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
             in_stack_fffffffffffffeb0);
  __a = &local_b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,pcVar2,__a);
  Imf_2_5::Image::insertChannel
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
             in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
             SUB41((uint)in_stack_fffffffffffffe78 >> 0x18,0));
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  img = (DeepImage *)local_d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,pcVar2,__a);
  Imf_2_5::Image::insertChannel
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
             in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
             SUB41((uint)in_stack_fffffffffffffe78 >> 0x18,0));
  std::__cxx11::string::~string((string *)(local_d9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,pcVar2,__a);
  Imf_2_5::Image::insertChannel
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
             in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
             SUB41((uint)in_stack_fffffffffffffe78 >> 0x18,0));
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,pcVar2,__a);
  Imf_2_5::Image::insertChannel
            (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,
             in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
             SUB41((uint)in_stack_fffffffffffffe78 >> 0x18,0));
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  Imath_2_5::Rand48::Rand48(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  poVar1 = std::operator<<((ostream *)&std::cout,"    generating random pixel values");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  fillChannels((Rand48 *)__a,img);
  poVar1 = std::operator<<((ostream *)&std::cout,"    saving file");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Imf_2_5::saveDeepTiledImage
            ((string *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             (DeepImage *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  Imf_2_5::DeepImage::DeepImage((DeepImage *)__a);
  poVar1 = std::operator<<((ostream *)&std::cout,"    loading file");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Imf_2_5::loadDeepImage
            ((string *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             (DeepImage *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  poVar1 = std::operator<<((ostream *)&std::cout,"    comparing");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  verifyImagesAreEqual
            ((DeepImage *)in_stack_fffffffffffffe90,(DeepImage *)in_stack_fffffffffffffe88,
             in_stack_fffffffffffffe84,in_stack_fffffffffffffe80);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  remove(pcVar2);
  Imf_2_5::DeepImage::~DeepImage((DeepImage *)0x11f8e2);
  Imf_2_5::DeepImage::~DeepImage((DeepImage *)0x11f8ef);
  return;
}

Assistant:

void
testTiledImage
    (const Box2i &dataWindow,
     const string &fileName,
     LevelMode levelMode,
     LevelRoundingMode levelRoundingMode)
{
    cout << "tiles, data window = "
            "(" << dataWindow.min.x << ", " << dataWindow.min.y << ") - "
            "(" << dataWindow.max.x << ", " << dataWindow.max.y << "), "
            "level mode = " << levelMode << ", "
            "rounding mode = " << levelRoundingMode << endl;

    FlatImage img1;
    img1.resize (dataWindow, levelMode, levelRoundingMode);

    img1.insertChannel ("H1", HALF, 1, 1, false);
    img1.insertChannel ("H2", HALF, 1, 1, true);
    img1.insertChannel ("F", FLOAT, 1, 1, false);
    img1.insertChannel ("UI", UINT, 1, 1, false);

    Rand48 random (0);
    cout << "    generating random pixel values" << endl;
    fillChannels (random, img1);

    cout << "    saving file" << endl;
    saveFlatTiledImage (fileName, img1);
    
    FlatImage img2;

    cout << "    loading file" << endl;
    loadFlatImage (fileName, img2);

    cout << "    comparing" << endl;
    verifyImagesAreEqual (img1, img2);

    remove (fileName.c_str());
}